

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

void __thiscall
CmdLineArgsParser::ParsePhase(CmdLineArgsParser *this,Phases *pPhaseList,Phases *oppositePhase)

{
  bool bVar1;
  Phase phase_00;
  char16 cVar2;
  LPWSTR str;
  Exception *this_00;
  Range *pRange;
  RangeBase<Js::SourceFunctionNode> *this_01;
  Range *local_448;
  Range *oppositeRange;
  WCHAR local_428 [3];
  Phase phase;
  char16 buffer [512];
  Phases *oppositePhase_local;
  Phases *pPhaseList_local;
  CmdLineArgsParser *this_local;
  
  memset(local_428,0,0x400);
  str = ParseString(this,local_428,0x200,true);
  phase_00 = Js::ConfigFlagsTable::GetPhase(str);
  if (phase_00 != InvalidPhase) {
    Js::Phases::Enable(pPhaseList,phase_00);
    cVar2 = CurChar(this);
    if (cVar2 == L',') {
      NextChar(this);
      if (oppositePhase != (Phases *)0x0) {
        Js::Phases::Disable(oppositePhase,phase_00);
      }
      ParsePhase(this,pPhaseList,oppositePhase);
    }
    else if (cVar2 == L':') {
      NextChar(this);
      local_448 = (Range *)0x0;
      if ((oppositePhase != (Phases *)0x0) &&
         (bVar1 = Js::Phases::IsEnabled(oppositePhase,phase_00), bVar1)) {
        local_448 = Js::Phases::GetRange(oppositePhase,phase_00);
      }
      pRange = Js::Phases::GetRange(pPhaseList,phase_00);
      ParseRange(this,pRange,local_448);
    }
    else {
      if (oppositePhase != (Phases *)0x0) {
        Js::Phases::Disable(oppositePhase,phase_00);
      }
      this_01 = &Js::Phases::GetRange(pPhaseList,phase_00)->super_RangeBase<Js::SourceFunctionNode>;
      Js::RangeBase<Js::SourceFunctionNode>::Clear(this_01);
    }
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(8);
  Exception::Exception(this_00,L"Invalid phase :");
  __cxa_throw(this_00,&Exception::typeinfo,0);
}

Assistant:

void
CmdLineArgsParser::ParsePhase(Js::Phases *pPhaseList, Js::Phases *oppositePhase)
{
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    Phase phase = ConfigFlagsTable::GetPhase(ParseString(buffer));
    if(InvalidPhase == phase)
    {
        throw Exception(_u("Invalid phase :"));
    }

    pPhaseList->Enable(phase);
    switch(CurChar())
    {
    case ':':
    {
        NextChar();
        Js::Range* oppositeRange = nullptr;
        if (oppositePhase && oppositePhase->IsEnabled(phase))
        {
            oppositeRange = oppositePhase->GetRange(phase);
        }
        ParseRange(pPhaseList->GetRange(phase), oppositeRange);
        break;
    }
    case ',':
        NextChar();
        if (oppositePhase)
        {
            // The whole phase is turned on/off so disable the opposite
            oppositePhase->Disable(phase);
        }
        ParsePhase(pPhaseList, oppositePhase);
        break;
    default:
        if (oppositePhase)
        {
            // The whole phase is turned on/off so disable the opposite
            oppositePhase->Disable(phase);
        }
        pPhaseList->GetRange(phase)->Clear();
        break;
    }
}